

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall hwnet::util::TimerMgr::down(TimerMgr *this,size_t idx)

{
  ulong uVar1;
  size_t sVar2;
  size_t index;
  size_t sVar3;
  size_t __n;
  reference ppTVar4;
  size_t offsetMin;
  size_t offsetR;
  size_t offsetL;
  size_t offsetIdx;
  size_t min;
  size_t r;
  size_t l;
  size_t idx_local;
  TimerMgr *this_local;
  
  sVar2 = left(this,idx);
  index = right(this,idx);
  sVar3 = getOffset(this,idx);
  offsetIdx = idx;
  if (sVar2 <= this->elements_size) {
    __n = getOffset(this,sVar2);
    ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,__n);
    uVar1 = (*ppTVar4)->mExpiredTime;
    ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,sVar3);
    offsetIdx = idx;
    if (uVar1 < (*ppTVar4)->mExpiredTime) {
      offsetIdx = sVar2;
    }
  }
  if (index <= this->elements_size) {
    sVar2 = getOffset(this,index);
    sVar3 = getOffset(this,offsetIdx);
    ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,sVar2);
    uVar1 = (*ppTVar4)->mExpiredTime;
    ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                        (&this->elements,sVar3);
    if (uVar1 < (*ppTVar4)->mExpiredTime) {
      offsetIdx = index;
    }
  }
  if (offsetIdx != idx) {
    swap(this,idx,offsetIdx);
    down(this,offsetIdx);
  }
  return;
}

Assistant:

void down(size_t idx) {
		auto l = left(idx);
		auto r = right(idx);
		auto min = idx;

		auto offsetIdx = getOffset(idx);
		
		if(l <= this->elements_size) {
			auto offsetL = getOffset(l);
			if(this->elements[offsetL]->mExpiredTime < this->elements[offsetIdx]->mExpiredTime) {
				min = l;
			}
		}

		if(r <= this->elements_size) {
			auto offsetR = getOffset(r);
			auto offsetMin = getOffset(min);
			if(this->elements[offsetR]->mExpiredTime < this->elements[offsetMin]->mExpiredTime) {
				min = r;
			}
		}

		if(min != idx) {
			this->swap(idx,min);
			this->down(min);
		}	
	}